

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O0

bool __thiscall QFSFileEngine::setSize(QFSFileEngine *this,qint64 size)

{
  long lVar1;
  int iVar2;
  QFSFileEnginePrivate *this_00;
  char *__file;
  __off64_t in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  bool ret;
  QFSFileEnginePrivate *d;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  uint uVar3;
  FileError error;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFSFileEngine *)0x1727af);
  uVar3 = in_stack_ffffffffffffffac & 0xffffff;
  if (this_00->fd == -1) {
    if (this_00->fh == (FILE *)0x0) {
      QFileSystemEntry::nativeFilePath
                ((QFileSystemEntry *)
                 (CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8) & 0xffffffffffffff))
      ;
      __file = QByteArray::constData((QByteArray *)0x172841);
      iVar2 = truncate64(__file,in_RSI);
      error = CONCAT13(iVar2 == 0,(int3)uVar3);
      QByteArray::~QByteArray((QByteArray *)0x172864);
    }
    else {
      iVar2 = fileno((FILE *)this_00->fh);
      iVar2 = ftruncate64(iVar2,in_RSI);
      error = CONCAT13(iVar2 == 0,(int3)uVar3);
    }
  }
  else {
    iVar2 = ftruncate64(this_00->fd,in_RSI);
    error = CONCAT13(iVar2 == 0,(int3)uVar3);
  }
  if ((error & 0x1000000) == NoError) {
    __errno_location();
    qt_error_string(error);
    QAbstractFileEngine::setError((QAbstractFileEngine *)this_00,error,in_RDI);
    QString::~QString((QString *)0x17289c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)((byte)(error >> 0x18) & 1);
}

Assistant:

bool QFSFileEngine::setSize(qint64 size)
{
    Q_D(QFSFileEngine);
    bool ret = false;
    if (d->fd != -1)
        ret = QT_FTRUNCATE(d->fd, size) == 0;
    else if (d->fh)
        ret = QT_FTRUNCATE(QT_FILENO(d->fh), size) == 0;
    else
        ret = QT_TRUNCATE(d->fileEntry.nativeFilePath().constData(), size) == 0;
    if (!ret)
        setError(QFile::ResizeError, qt_error_string(errno));
    return ret;
}